

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error ps_table_add(PS_Table table,FT_Int idx,void *object,FT_UInt length)

{
  FT_Byte **ppFVar1;
  ulong uVar2;
  FT_Memory memory;
  FT_Offset FVar3;
  FT_Error FVar4;
  ulong uVar5;
  FT_Byte *pFVar6;
  FT_Byte **ppFVar7;
  ulong uVar8;
  ulong uVar9;
  ulong __n;
  ulong size;
  int local_3c;
  FT_Byte *pFStack_38;
  FT_Error error;
  
  FVar4 = 6;
  if ((-1 < idx) && (FVar4 = 6, idx < table->max_elems)) {
    __n = (ulong)length;
    uVar5 = table->cursor + __n;
    uVar2 = table->capacity;
    if (uVar2 < uVar5) {
      pFStack_38 = table->block;
      uVar9 = (long)object - (long)pFStack_38;
      size = uVar2;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (long)uVar9) {
        uVar8 = uVar9;
      }
      do {
        size = size + (size >> 2) + 0x400 & 0xfffffffffffffc00;
      } while (size < uVar5);
      uVar5 = 0xffffffffffffffff;
      if (uVar9 < uVar2) {
        uVar5 = uVar8;
      }
      memory = table->memory;
      pFVar6 = (FT_Byte *)ft_mem_alloc(memory,size,&local_3c);
      table->block = pFVar6;
      if (local_3c == 0) {
        if (pFStack_38 != (FT_Byte *)0x0) {
          memcpy(pFVar6,pFStack_38,table->capacity);
          if (0 < (long)table->max_elems) {
            pFVar6 = table->block;
            ppFVar7 = table->elements;
            ppFVar1 = ppFVar7 + table->max_elems;
            do {
              if (*ppFVar7 != (FT_Byte *)0x0) {
                *ppFVar7 = *ppFVar7 + ((long)pFVar6 - (long)pFStack_38);
              }
              ppFVar7 = ppFVar7 + 1;
            } while (ppFVar7 < ppFVar1);
          }
          ft_mem_free(memory,pFStack_38);
        }
        table->capacity = size;
        local_3c = 0;
      }
      else {
        table->block = pFStack_38;
      }
      if ((local_3c == 0) && (-1 < (long)uVar5)) {
        object = table->block + uVar5;
      }
      if (local_3c != 0) {
        return local_3c;
      }
    }
    FVar3 = table->cursor;
    table->elements[(uint)idx] = table->block + FVar3;
    table->lengths[(uint)idx] = length;
    memcpy(table->block + FVar3,object,__n);
    table->cursor = table->cursor + __n;
    FVar4 = 0;
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_table_add( PS_Table  table,
                FT_Int    idx,
                void*     object,
                FT_UInt   length )
  {
    if ( idx < 0 || idx >= table->max_elems )
    {
      FT_ERROR(( "ps_table_add: invalid index\n" ));
      return FT_THROW( Invalid_Argument );
    }

    /* grow the base block if needed */
    if ( table->cursor + length > table->capacity )
    {
      FT_Error    error;
      FT_Offset   new_size = table->capacity;
      FT_PtrDist  in_offset;


      in_offset = (FT_Byte*)object - table->block;
      if ( in_offset < 0 || (FT_Offset)in_offset >= table->capacity )
        in_offset = -1;

      while ( new_size < table->cursor + length )
      {
        /* increase size by 25% and round up to the nearest multiple
           of 1024 */
        new_size += ( new_size >> 2 ) + 1;
        new_size  = FT_PAD_CEIL( new_size, 1024 );
      }

      error = reallocate_t1_table( table, new_size );
      if ( error )
        return error;

      if ( in_offset >= 0 )
        object = table->block + in_offset;
    }

    /* add the object to the base block and adjust offset */
    table->elements[idx] = table->block + table->cursor;
    table->lengths [idx] = length;
    FT_MEM_COPY( table->block + table->cursor, object, length );

    table->cursor += length;
    return FT_Err_Ok;
  }